

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall
Engine_testIncrNoTags_Test::~Engine_testIncrNoTags_Test(Engine_testIncrNoTags_Test *this)

{
  void *in_RDI;
  
  ~Engine_testIncrNoTags_Test((Engine_testIncrNoTags_Test *)0x130128);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Engine, testIncrNoTags) {
    Engine e("test", std::make_unique<TestHandler>());
    e.Incr("foo");
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->intMeasures.size());
    auto im = th->intMeasures[0];
    ASSERT_EQ("test.foo", im.name);
    ASSERT_EQ(MetricType::Counter, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(1, im.value);
    ASSERT_EQ(0, im.tags.size());
}